

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManComputeForward2(Of_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Of_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->pGia->nObjs) {
      pGStack_18 = Gia_ManObj(p->pGia,local_1c);
      bVar2 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(pGStack_18);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsBuf(pGStack_18);
      if (iVar1 == 0) {
        Of_ManComputeForwardObj2(p,local_1c);
      }
      else {
        iVar1 = Gia_ObjFaninId0(pGStack_18,local_1c);
        iVar1 = Of_ObjDelay1(p,iVar1);
        Of_ObjSetDelay1(p,local_1c,iVar1);
      }
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Of_ManComputeForward2( Of_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Of_ObjSetDelay1( p, i, Of_ObjDelay1(p, Gia_ObjFaninId0(pObj, i)) );
        else
            Of_ManComputeForwardObj2( p, i );
}